

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

bool __thiscall
despot::util::tinyxml::TiXmlElement::Accept(TiXmlElement *this,TiXmlVisitor *visitor)

{
  byte bVar1;
  uint uVar2;
  TiXmlAttribute *pTVar3;
  ulong uVar4;
  TiXmlNode *local_20;
  TiXmlNode *node;
  TiXmlVisitor *visitor_local;
  TiXmlElement *this_local;
  
  pTVar3 = TiXmlAttributeSet::First(&this->attributeSet);
  uVar4 = (**(code **)(*(long *)visitor + 0x20))(visitor,this,pTVar3);
  if ((uVar4 & 1) != 0) {
    local_20 = TiXmlNode::FirstChild(&this->super_TiXmlNode);
    while ((local_20 != (TiXmlNode *)0x0 &&
           (uVar2 = (*(local_20->super_TiXmlBase)._vptr_TiXmlBase[0x11])(local_20,visitor),
           (uVar2 & 1) != 0))) {
      local_20 = TiXmlNode::NextSibling(local_20);
    }
  }
  bVar1 = (**(code **)(*(long *)visitor + 0x28))(visitor,this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TiXmlElement::Accept(TiXmlVisitor* visitor) const {
	if (visitor->VisitEnter(*this, attributeSet.First())) {
		for (const TiXmlNode* node = FirstChild(); node;
			node = node->NextSibling()) {
			if (!node->Accept(visitor))
				break;
		}
	}
	return visitor->VisitExit(*this);
}